

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O3

void __thiscall
chrono::ChLoad<chrono::ChLoaderXYZnode>::LoadStateIncrement
          (ChLoad<chrono::ChLoaderXYZnode> *this,ChState *x,ChStateDelta *dw,ChState *x_new)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar2;
  
  peVar1 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)((long)&peVar1->field_0x0 + *(long *)((long)*peVar1 + -0x78));
  }
  this_00 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
            super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 0x30))(plVar2,0,x_new,x,0,dw);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadStateIncrement(const ChState& x, const ChStateDelta& dw, ChState& x_new) {
    this->loader.GetLoadable()->LoadableStateIncrement(0, x_new, x, 0, dw);
}